

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::SPxMainSM<double>::simplify
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,Real remainingTime,bool keepbounds,
          uint32_t seed)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int *piVar3;
  Result RVar4;
  double *pdVar5;
  SPxOut *pSVar6;
  undefined7 in_register_00000011;
  int iVar7;
  int i;
  int iVar8;
  long lVar9;
  int j;
  int iVar10;
  bool again;
  Verbosity old_verbosity;
  double local_68;
  ulong uStack_60;
  Verbosity old_verbosity_1;
  undefined4 uStack_54;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined4 local_44;
  double local_40;
  double local_38;
  
  (this->super_SPxSimplifier<double>).spxout = lp->spxout;
  this->m_thesense = lp->thesense;
  (*((this->super_SPxSimplifier<double>).m_timeUsed)->_vptr_Timer[2])(remainingTime);
  (*((this->super_SPxSimplifier<double>).m_timeUsed)->_vptr_Timer[3])();
  (this->super_SPxSimplifier<double>).m_objoffset = 0.0;
  pdVar5 = (double *)infinity();
  this->m_cutoffbound = -*pdVar5;
  pdVar5 = (double *)infinity();
  this->m_pseudoobj = -*pdVar5;
  this->m_result = OKAY;
  (this->super_SPxSimplifier<double>).m_chgBnds = 0;
  (this->super_SPxSimplifier<double>).m_chgLRhs = 0;
  (this->super_SPxSimplifier<double>).m_keptBnds = 0;
  (this->super_SPxSimplifier<double>).m_keptLRhs = 0;
  (this->super_SPxSimplifier<double>).m_remRows = 0;
  (this->super_SPxSimplifier<double>).m_remCols = 0;
  (this->super_SPxSimplifier<double>).m_remNzos = 0;
  (this->super_SPxSimplifier<double>).m_chgBnds = 0;
  again = true;
  if (0 < (int)((ulong)((long)(this->m_hist).data.
                              super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_hist).data.
                             super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    std::
    vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
    ::clear(&(this->m_hist).data);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
  ::resize(&(this->m_hist).data,0);
  this->m_postsolved = false;
  pSVar6 = (this->super_SPxSimplifier<double>).spxout;
  local_44 = (undefined4)CONCAT71(in_register_00000011,keepbounds);
  if ((pSVar6 != (SPxOut *)0x0) && (3 < (int)pSVar6->m_verbosity)) {
    old_verbosity_1 = INFO2;
    old_verbosity = pSVar6->m_verbosity;
    (*pSVar6->_vptr_SPxOut[2])();
    iVar7 = 0;
    iVar10 = 0;
    for (lVar9 = 0; lVar9 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        lVar9 = lVar9 + 1) {
      local_68 = (lp->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar9];
      pdVar5 = (double *)infinity();
      if (-*pdVar5 < local_68) {
        local_68 = (lp->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
        pdVar5 = (double *)infinity();
        if (local_68 < *pdVar5) {
          local_68 = (lp->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
          uStack_60 = 0;
          local_38 = (lp->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                     &old_verbosity_1,
                     &(this->super_SPxSimplifier<double>)._tolerances.
                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
          local_40 = Tolerances::epsilon((Tolerances *)CONCAT44(uStack_54,old_verbosity_1));
          local_68 = ABS(local_68 - local_38);
          uStack_60 = uStack_60 & 0x7fffffffffffffff;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
          if (local_68 <= local_40) {
            iVar10 = iVar10 + 1;
          }
          else {
            iVar7 = iVar7 + 1;
          }
        }
      }
    }
    iVar8 = 0;
    for (lVar9 = 0; lVar9 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        lVar9 = lVar9 + 1) {
      local_68 = (lp->super_LPColSetBase<double>).low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar9];
      pdVar5 = (double *)infinity();
      if (-*pdVar5 < local_68) {
        local_68 = (lp->super_LPColSetBase<double>).up.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
        pdVar5 = (double *)infinity();
        if (local_68 < *pdVar5) {
          iVar8 = iVar8 + 1;
        }
      }
    }
    pSVar6 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,"LP has ");
    pSVar6 = soplex::operator<<(pSVar6,iVar10);
    pSVar6 = soplex::operator<<(pSVar6," equations, ");
    pSVar6 = soplex::operator<<(pSVar6,iVar7);
    pSVar6 = soplex::operator<<(pSVar6," ranged rows, ");
    pSVar6 = soplex::operator<<(pSVar6,iVar8);
    pSVar6 = soplex::operator<<(pSVar6," boxed columns");
    std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
    pSVar6 = (this->super_SPxSimplifier<double>).spxout;
    (*pSVar6->_vptr_SPxOut[2])(pSVar6,&old_verbosity);
    keepbounds = SUB41(local_44,0);
  }
  DataArray<int>::reSize(&this->m_stat,0x11);
  piVar3 = (this->m_stat).data;
  for (lVar9 = 0; lVar9 < (this->m_stat).thesize; lVar9 = lVar9 + 1) {
    piVar3[lVar9] = 0;
  }
  this->m_addedcols = 0;
  handleRowObjectives(this,lp);
  iVar7 = 1;
  VectorBase<double>::reDim
            (&this->m_prim,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,true)
  ;
  VectorBase<double>::reDim
            (&this->m_slack,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,true
            );
  VectorBase<double>::reDim
            (&this->m_dual,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,true)
  ;
  VectorBase<double>::reDim
            (&this->m_redCost,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,
             true);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
            (&this->m_cBasisStat,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum
            );
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
            (&this->m_rBasisStat,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum
            );
  DataArray<int>::reSize
            (&this->m_cIdx,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  DataArray<int>::reSize
            (&this->m_rIdx,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  Array<soplex::DSVectorBase<double>_>::reSize
            (&this->m_classSetRows,
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  Array<soplex::DSVectorBase<double>_>::reSize
            (&this->m_classSetCols,
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  Array<soplex::DSVectorBase<double>_>::reSize
            (&this->m_dupRows,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  Array<soplex::DSVectorBase<double>_>::reSize
            (&this->m_dupCols,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  this->m_keepbounds = keepbounds;
  piVar3 = (this->m_rIdx).data;
  for (lVar9 = 0; lVar9 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      lVar9 = lVar9 + 1) {
    piVar3[lVar9] = (int)lVar9;
  }
  piVar3 = (this->m_cIdx).data;
  for (lVar9 = 0; lVar9 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      lVar9 = lVar9 + 1) {
    piVar3[lVar9] = (int)lVar9;
  }
  handleExtremes(this,lp);
  RVar4 = this->m_result;
  while ((again == true && (RVar4 == OKAY))) {
    pSVar6 = (this->super_SPxSimplifier<double>).spxout;
    if ((pSVar6 == (SPxOut *)0x0) || ((int)pSVar6->m_verbosity < 5)) {
LAB_001ad962:
      again = false;
      RVar4 = simplifyRows(this,lp,&again);
      this->m_result = RVar4;
      if (RVar4 == OKAY) {
        RVar4 = simplifyCols(this,lp,&again);
        this->m_result = RVar4;
      }
    }
    else {
      old_verbosity = INFO3;
      old_verbosity_1 = pSVar6->m_verbosity;
      (*pSVar6->_vptr_SPxOut[2])(pSVar6,&old_verbosity);
      pSVar6 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,"Round ");
      pSVar6 = soplex::operator<<(pSVar6,iVar7);
      pSVar6 = soplex::operator<<(pSVar6,":");
      std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
      pSVar6 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar6->_vptr_SPxOut[2])(pSVar6,&old_verbosity_1);
      RVar4 = this->m_result;
      again = false;
      if (RVar4 == OKAY) goto LAB_001ad962;
    }
    if (again == false) {
      if (RVar4 == OKAY) {
        RVar4 = simplifyDual(this,lp,&again);
        this->m_result = RVar4;
      }
      if ((again & 1U) == 0) {
        if (RVar4 == OKAY) {
          RVar4 = duplicateRows(this,lp,&again);
          this->m_result = RVar4;
          if (RVar4 == OKAY) {
            RVar4 = duplicateCols(this,lp,&again);
            this->m_result = RVar4;
          }
        }
        if (again != true) {
          trivialHeuristic(this,lp);
          propagatePseudoobj(this,lp);
          RVar4 = this->m_result;
          if (RVar4 == OKAY) {
            RVar4 = multiaggregation(this,lp,&again);
            this->m_result = RVar4;
          }
        }
      }
    }
    iVar7 = iVar7 + 1;
  }
  if (RVar4 != OKAY) {
    pSVar6 = (this->super_SPxSimplifier<double>).spxout;
    if ((pSVar6 != (SPxOut *)0x0) &&
       (old_verbosity_1 = pSVar6->m_verbosity, 2 < (int)old_verbosity_1)) {
      old_verbosity = INFO1;
      (*pSVar6->_vptr_SPxOut[2])();
      pSVar6 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,"Simplifier result: ");
      pSVar6 = soplex::operator<<(pSVar6,this->m_result);
      std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
      pSVar6 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar6->_vptr_SPxOut[2])(pSVar6,&old_verbosity_1);
    }
    goto LAB_001ae120;
  }
  iVar7 = this->m_addedcols;
  uVar1 = (this->super_SPxSimplifier<double>).m_remCols;
  uVar2 = (this->super_SPxSimplifier<double>).m_remNzos;
  (this->super_SPxSimplifier<double>).m_remCols = uVar1 - iVar7;
  (this->super_SPxSimplifier<double>).m_remNzos = uVar2 - iVar7;
  pSVar6 = (this->super_SPxSimplifier<double>).spxout;
  if (pSVar6 == (SPxOut *)0x0) {
LAB_001ade17:
    pSVar6 = (SPxOut *)0x0;
  }
  else {
    if (2 < (int)pSVar6->m_verbosity) {
      old_verbosity = INFO1;
      old_verbosity_1 = pSVar6->m_verbosity;
      (*pSVar6->_vptr_SPxOut[2])();
      pSVar6 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,"Simplifier removed ");
      pSVar6 = soplex::operator<<(pSVar6,(this->super_SPxSimplifier<double>).m_remRows);
      pSVar6 = soplex::operator<<(pSVar6," rows, ");
      pSVar6 = soplex::operator<<(pSVar6,(this->super_SPxSimplifier<double>).m_remCols);
      pSVar6 = soplex::operator<<(pSVar6," columns, ");
      pSVar6 = soplex::operator<<(pSVar6,(this->super_SPxSimplifier<double>).m_remNzos);
      pSVar6 = soplex::operator<<(pSVar6," nonzeros, ");
      pSVar6 = soplex::operator<<(pSVar6,(this->super_SPxSimplifier<double>).m_chgBnds);
      pSVar6 = soplex::operator<<(pSVar6," col bounds, ");
      pSVar6 = soplex::operator<<(pSVar6,(this->super_SPxSimplifier<double>).m_chgLRhs);
      pSVar6 = soplex::operator<<(pSVar6," row bounds");
      std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
      pSVar6 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar6->_vptr_SPxOut[2])(pSVar6,&old_verbosity_1);
      pSVar6 = (this->super_SPxSimplifier<double>).spxout;
    }
    if ((char)local_44 != '\0') {
      if (pSVar6 != (SPxOut *)0x0) {
        if (3 < (int)pSVar6->m_verbosity) {
          old_verbosity = INFO2;
          old_verbosity_1 = pSVar6->m_verbosity;
          (*pSVar6->_vptr_SPxOut[2])();
          pSVar6 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,"Simplifier kept ")
          ;
          pSVar6 = soplex::operator<<(pSVar6,(this->super_SPxSimplifier<double>).m_keptBnds);
          pSVar6 = soplex::operator<<(pSVar6," column bounds, ");
          pSVar6 = soplex::operator<<(pSVar6,(this->super_SPxSimplifier<double>).m_keptLRhs);
          pSVar6 = soplex::operator<<(pSVar6," row bounds");
          std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
          pSVar6 = (this->super_SPxSimplifier<double>).spxout;
          (*pSVar6->_vptr_SPxOut[2])(pSVar6,&old_verbosity_1);
          pSVar6 = (this->super_SPxSimplifier<double>).spxout;
          goto LAB_001adc43;
        }
        goto LAB_001adc4c;
      }
      goto LAB_001ade17;
    }
LAB_001adc43:
    if (pSVar6 == (SPxOut *)0x0) goto LAB_001ade17;
LAB_001adc4c:
    if (2 < (int)pSVar6->m_verbosity) {
      old_verbosity = INFO1;
      old_verbosity_1 = pSVar6->m_verbosity;
      (*pSVar6->_vptr_SPxOut[2])();
      pSVar6 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,"Reduced LP has ");
      pSVar6 = soplex::operator<<(pSVar6,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                         set.thenum);
      pSVar6 = soplex::operator<<(pSVar6," rows ");
      pSVar6 = soplex::operator<<(pSVar6,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.
                                         set.thenum);
      pSVar6 = soplex::operator<<(pSVar6," columns ");
      iVar7 = SPxLPBase<double>::nNzos(lp);
      pSVar6 = soplex::operator<<(pSVar6,iVar7);
      pSVar6 = soplex::operator<<(pSVar6," nonzeros");
      std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
      pSVar6 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar6->_vptr_SPxOut[2])(pSVar6,&old_verbosity_1);
      pSVar6 = (this->super_SPxSimplifier<double>).spxout;
      if (pSVar6 == (SPxOut *)0x0) goto LAB_001ade17;
    }
    if (3 < (int)pSVar6->m_verbosity) {
      old_verbosity_1 = INFO2;
      old_verbosity = pSVar6->m_verbosity;
      (*pSVar6->_vptr_SPxOut[2])();
      iVar7 = 0;
      iVar10 = 0;
      for (lVar9 = 0; lVar9 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
          lVar9 = lVar9 + 1) {
        local_68 = (lp->super_LPRowSetBase<double>).left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
        pdVar5 = (double *)infinity();
        if (-*pdVar5 < local_68) {
          local_68 = (lp->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
          pdVar5 = (double *)infinity();
          if (local_68 < *pdVar5) {
            local_68 = (lp->super_LPRowSetBase<double>).left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar9];
            uStack_60 = 0;
            local_38 = (lp->super_LPRowSetBase<double>).right.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar9];
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                       &old_verbosity_1,
                       &(this->super_SPxSimplifier<double>)._tolerances.
                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
            local_40 = Tolerances::epsilon((Tolerances *)CONCAT44(uStack_54,old_verbosity_1));
            local_68 = ABS(local_68 - local_38);
            uStack_60 = uStack_60 & 0x7fffffffffffffff;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
            if (local_68 <= local_40) {
              iVar10 = iVar10 + 1;
            }
            else {
              iVar7 = iVar7 + 1;
            }
          }
        }
      }
      iVar8 = 0;
      for (lVar9 = 0; lVar9 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
          lVar9 = lVar9 + 1) {
        local_68 = (lp->super_LPColSetBase<double>).low.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
        pdVar5 = (double *)infinity();
        if (-*pdVar5 < local_68) {
          local_68 = (lp->super_LPColSetBase<double>).up.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
          pdVar5 = (double *)infinity();
          if (local_68 < *pdVar5) {
            iVar8 = iVar8 + 1;
          }
        }
      }
      pSVar6 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,"Reduced LP has ");
      pSVar6 = soplex::operator<<(pSVar6,iVar10);
      pSVar6 = soplex::operator<<(pSVar6," equations, ");
      pSVar6 = soplex::operator<<(pSVar6,iVar7);
      pSVar6 = soplex::operator<<(pSVar6," ranged rows, ");
      pSVar6 = soplex::operator<<(pSVar6,iVar8);
      pSVar6 = soplex::operator<<(pSVar6," boxed columns");
      std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
      pSVar6 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar6->_vptr_SPxOut[2])(pSVar6,&old_verbosity);
      pSVar6 = (this->super_SPxSimplifier<double>).spxout;
    }
  }
  if ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum == 0 &&
      (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum == 0) {
    if (pSVar6 == (SPxOut *)0x0) {
      pSVar6 = (SPxOut *)0x0;
    }
    else if (2 < (int)pSVar6->m_verbosity) {
      old_verbosity = INFO1;
      old_verbosity_1 = pSVar6->m_verbosity;
      (*pSVar6->_vptr_SPxOut[2])();
      pSVar6 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                  "Simplifier removed all rows and columns");
      std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
      pSVar6 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar6->_vptr_SPxOut[2])(pSVar6,&old_verbosity_1);
      pSVar6 = (this->super_SPxSimplifier<double>).spxout;
    }
    this->m_result = VANISHED;
  }
  if ((pSVar6 != (SPxOut *)0x0) && (3 < (int)pSVar6->m_verbosity)) {
    old_verbosity = INFO2;
    old_verbosity_1 = pSVar6->m_verbosity;
    (*pSVar6->_vptr_SPxOut[2])();
    pSVar6 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                "\nSimplifier performed:\n");
    pSVar6 = soplex::operator<<(pSVar6,*(this->m_stat).data);
    pSVar6 = soplex::operator<<(pSVar6," empty rows\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[1]);
    pSVar6 = soplex::operator<<(pSVar6," free rows\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[2]);
    pSVar6 = soplex::operator<<(pSVar6," singleton rows\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[3]);
    pSVar6 = soplex::operator<<(pSVar6," forcing rows\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[4]);
    pSVar6 = soplex::operator<<(pSVar6," empty columns\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[5]);
    pSVar6 = soplex::operator<<(pSVar6," fixed columns\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[6]);
    pSVar6 = soplex::operator<<(pSVar6," free columns with zero objective\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[7]);
    pSVar6 = soplex::operator<<(pSVar6," singleton columns with zero objective\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[8]);
    pSVar6 = soplex::operator<<(pSVar6," singleton columns combined with a doubleton equation\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[9]);
    pSVar6 = soplex::operator<<(pSVar6," free singleton columns\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[10]);
    pSVar6 = soplex::operator<<(pSVar6," dominated columns\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[0xb]);
    pSVar6 = soplex::operator<<(pSVar6," weakly dominated columns\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[0xc]);
    pSVar6 = soplex::operator<<(pSVar6," duplicate rows\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[0xd]);
    pSVar6 = soplex::operator<<(pSVar6," duplicate columns (fixed)\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[0xe]);
    pSVar6 = soplex::operator<<(pSVar6," duplicate columns (substituted)\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[0xf]);
    pSVar6 = soplex::operator<<(pSVar6," variable aggregations\n");
    pSVar6 = soplex::operator<<(pSVar6,(this->m_stat).data[0x10]);
    pSVar6 = soplex::operator<<(pSVar6," multi aggregations\n");
    std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
    pSVar6 = (this->super_SPxSimplifier<double>).spxout;
    (*pSVar6->_vptr_SPxOut[2])(pSVar6,&old_verbosity_1);
  }
  (*((this->super_SPxSimplifier<double>).m_timeUsed)->_vptr_Timer[4])();
LAB_001ae120:
  return this->m_result;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::simplify(SPxLPBase<R>& lp, Real remainingTime,
      bool keepbounds, uint32_t seed)
{
   // transfer message handler
   this->spxout = lp.spxout;
   assert(this->spxout != nullptr);

   m_thesense = lp.spxSense();
   this->m_timeUsed->reset();
   this->m_timeUsed->start();

   this->m_objoffset = 0.0;
   m_cutoffbound = R(-infinity);
   m_pseudoobj = R(-infinity);

   this->m_remRows = 0;
   this->m_remCols = 0;
   this->m_remNzos = 0;
   this->m_chgBnds = 0;
   this->m_chgLRhs = 0;
   this->m_keptBnds = 0;
   this->m_keptLRhs = 0;

   m_result     = this->OKAY;
   bool   again = true;
   int nrounds = 0;

   if(m_hist.size() > 0)
   {
      m_hist.clear();
   }

   m_hist.reSize(0);
   m_postsolved = false;

   SPX_MSG_INFO2((*this->spxout),
                 int numRangedRows = 0;
                 int numBoxedCols = 0;
                 int numEqualities = 0;

                 for(int i = 0; i < lp.nRows(); ++i)
{
   if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
      {
         if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
            ++numEqualities;
         else
            ++numRangedRows;
      }
   }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         m_stat.reSize(17);

   for(int k = 0; k < m_stat.size(); ++k)
      m_stat[k] = 0;

   m_addedcols = 0;
   handleRowObjectives(lp);

   m_prim.reDim(lp.nCols());
   m_slack.reDim(lp.nRows());
   m_dual.reDim(lp.nRows());
   m_redCost.reDim(lp.nCols());
   m_cBasisStat.reSize(lp.nCols());
   m_rBasisStat.reSize(lp.nRows());
   m_cIdx.reSize(lp.nCols());
   m_rIdx.reSize(lp.nRows());

   m_classSetRows.reSize(lp.nRows());
   m_classSetCols.reSize(lp.nCols());
   m_dupRows.reSize(lp.nRows());
   m_dupCols.reSize(lp.nCols());

   m_keepbounds = keepbounds;

   for(int i = 0; i < lp.nRows(); ++i)
      m_rIdx[i] = i;

   for(int j = 0; j < lp.nCols(); ++j)
      m_cIdx[j] = j;

   // round extreme values (set all values smaller than this->eps to zero and all values bigger than R(infinity)/5 to R(infinity))
#if SOPLEX_EXTREMES
   handleExtremes(lp);
#endif

   // main presolving loop
   while(again && m_result == this->OKAY)
   {
      nrounds++;
      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Round " << nrounds << ":" << std::endl;)
      again = false;

#if SOPLEX_ROWS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyRows(lp, again);

#endif

#if SOPLEX_COLS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyCols(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUAL_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyDual(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUPLICATE_ROWS

      if(m_result == this->OKAY)
         m_result = duplicateRows(lp, again);

#endif

#if SOPLEX_DUPLICATE_COLS

      if(m_result == this->OKAY)
         m_result = duplicateCols(lp, again);

#endif

      if(!again)
      {
#if SOPLEX_TRIVIAL_HEURISTICS
         trivialHeuristic(lp);
#endif

#if SOPLEX_PSEUDOOBJ
         propagatePseudoobj(lp);
#endif

#if SOPLEX_MULTI_AGGREGATE

         if(m_result == this->OKAY)
            m_result = multiaggregation(lp, again);

#endif
      }

   }

   // preprocessing detected infeasibility or unboundedness
   if(m_result != this->OKAY)
   {
      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier result: " << static_cast<int>
                    (m_result) << std::endl;)
      return m_result;
   }

   this->m_remCols -= m_addedcols;
   this->m_remNzos -= m_addedcols;
   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed "
                 << this->m_remRows << " rows, "
                 << this->m_remCols << " columns, "
                 << this->m_remNzos << " nonzeros, "
                 << this->m_chgBnds << " col bounds, "
                 << this->m_chgLRhs << " row bounds"
                 << std::endl;)

   if(keepbounds)
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier kept "
                    << this->m_keptBnds << " column bounds, "
                    << this->m_keptLRhs << " row bounds"
                    << std::endl;)

      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Reduced LP has "
                    << lp.nRows() << " rows "
                    << lp.nCols() << " columns "
                    << lp.nNzos() << " nonzeros"
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout),
                    int numRangedRows = 0;
                    int numBoxedCols  = 0;
                    int numEqualities = 0;

                    for(int i = 0; i < lp.nRows(); ++i)
   {
      if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
         {
            if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
               ++numEqualities;
            else
               ++numRangedRows;
         }
      }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "Reduced LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         if(lp.nCols() == 0 && lp.nRows() == 0)
         {
            SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed all rows and columns" <<
                          std::endl;)
            m_result = this->VANISHED;
         }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "\nSimplifier performed:\n"
                 << m_stat[EMPTY_ROW]            << " empty rows\n"
                 << m_stat[FREE_ROW]             << " free rows\n"
                 << m_stat[SINGLETON_ROW]        << " singleton rows\n"
                 << m_stat[FORCE_ROW]            << " forcing rows\n"
                 << m_stat[EMPTY_COL]            << " empty columns\n"
                 << m_stat[FIX_COL]              << " fixed columns\n"
                 << m_stat[FREE_ZOBJ_COL]        << " free columns with zero objective\n"
                 << m_stat[ZOBJ_SINGLETON_COL]   << " singleton columns with zero objective\n"
                 << m_stat[DOUBLETON_ROW]        << " singleton columns combined with a doubleton equation\n"
                 << m_stat[FREE_SINGLETON_COL]   << " free singleton columns\n"
                 << m_stat[DOMINATED_COL]        << " dominated columns\n"
                 << m_stat[WEAKLY_DOMINATED_COL] << " weakly dominated columns\n"
                 << m_stat[DUPLICATE_ROW]        << " duplicate rows\n"
                 << m_stat[FIX_DUPLICATE_COL]    << " duplicate columns (fixed)\n"
                 << m_stat[SUB_DUPLICATE_COL]    << " duplicate columns (substituted)\n"
                 << m_stat[AGGREGATION]          << " variable aggregations\n"
                 << m_stat[MULTI_AGG]            << " multi aggregations\n"
                 << std::endl;);

   this->m_timeUsed->stop();

   return m_result;
}